

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,string *arg1,string *arg2,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  pointer pAVar1;
  pointer pTVar2;
  pointer pTVar3;
  type pTVar4;
  anon_class_8_1_70dd1d2d local_60;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  _Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor> local_38;
  iterator descriptor;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
  *selector_local;
  string *arg2_local;
  string *arg1_local;
  TransformAction action_local;
  cmList *this_local;
  
  descriptor._M_node = (_Base_ptr)selector;
  local_38._M_node = (_Base_ptr)anon_unknown.dwarf_8873c5::TransformConfigure(action,selector,2);
  pAVar1 = std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>::operator->
                     (&local_38);
  pTVar2 = std::
           unique_ptr<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           ::operator->(&pAVar1->Transform);
  pTVar3 = std::
           unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>::
           get(selector);
  (*pTVar2->_vptr_TransformAction[3])(pTVar2,pTVar3,arg1,arg2);
  pTVar4 = std::
           unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>::
           operator*(selector);
  local_60.descriptor = &local_38;
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<cmList::transform(cmList::TransformAction,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>)::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_58,&local_60);
  (*pTVar4->_vptr_TransformSelector[5])(pTVar4,this,&local_58);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_58);
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action, std::string const& arg1,
                          std::string const& arg2,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 2);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()), arg1, arg2);

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}